

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::JPEG2000PictureSubDescriptor::JPEG2000PictureSubDescriptor
          (JPEG2000PictureSubDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  JPEG2000PictureSubDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__JPEG2000PictureSubDescriptor_0033a9c0;
  this->Rsize = 0;
  this->Xsize = 0;
  this->Ysize = 0;
  this->XOsize = 0;
  this->YOsize = 0;
  this->XTsize = 0;
  this->YTsize = 0;
  this->XTOsize = 0;
  this->YTOsize = 0;
  this->Csize = 0;
  optional_property<ASDCP::MXF::Raw>::optional_property(&this->PictureComponentSizing);
  optional_property<ASDCP::MXF::Raw>::optional_property(&this->CodingStyleDefault);
  optional_property<ASDCP::MXF::Raw>::optional_property(&this->QuantizationDefault);
  optional_property<ASDCP::MXF::RGBALayout>::optional_property(&this->J2CLayout);
  optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType>::optional_property
            (&this->J2KExtendedCapabilities);
  optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::optional_property(&this->J2KProfile);
  optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::optional_property
            (&this->J2KCorrespondingProfile);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,MDD_JPEG2000PictureSubDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x8af,
                "ASDCP::MXF::JPEG2000PictureSubDescriptor::JPEG2000PictureSubDescriptor(const Dictionary *)"
               );
}

Assistant:

JPEG2000PictureSubDescriptor::JPEG2000PictureSubDescriptor(const Dictionary* d) : InterchangeObject(d), Rsize(0), Xsize(0), Ysize(0), XOsize(0), YOsize(0), XTsize(0), YTsize(0), XTOsize(0), YTOsize(0), Csize(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_JPEG2000PictureSubDescriptor);
}